

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O1

bool __thiscall units::precise_unit::operator==(precise_unit *this,unit *other)

{
  double dVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  if (other->base_units_ != this->base_units_) {
    return false;
  }
  dVar1 = this->multiplier_;
  fVar3 = other->multiplier_;
  if ((dVar1 != (double)fVar3) || (NAN(dVar1) || NAN((double)fVar3))) {
    fVar4 = (float)dVar1;
    fVar5 = fVar4 - fVar3;
    if (((fVar5 != 0.0) || (NAN(fVar5))) && ((NAN(fVar5) || (0x7ffffe < (int)ABS(fVar5) - 1U)))) {
      fVar5 = (float)((int)fVar4 + 8U & 0xfffffff0);
      fVar6 = (float)((int)fVar3 + 8U & 0xfffffff0);
      if ((fVar5 != fVar6) || (NAN(fVar5) || NAN(fVar6))) {
        fVar2 = (float)((int)(fVar3 * 1.0000005) + 8U & 0xfffffff0);
        if ((fVar5 != fVar2) || (NAN(fVar5) || NAN(fVar2))) {
          fVar3 = (float)((int)(fVar3 * 0.9999995) + 8U & 0xfffffff0);
          if ((fVar5 != fVar3) || (NAN(fVar5) || NAN(fVar3))) {
            fVar3 = (float)((int)(fVar4 * 1.0000005) + 8U & 0xfffffff0);
            if ((fVar6 != fVar3) || (NAN(fVar6) || NAN(fVar3))) {
              return (bool)(-(fVar6 == (float)((int)(fVar4 * 0.9999995) + 8U & 0xfffffff0)) & 1);
            }
          }
        }
      }
    }
  }
  return true;
}

Assistant:

constexpr bool equivalent_non_counting(const unit_data& other) const
        {
            return meter_ == other.meter_ && second_ == other.second_ &&
                kilogram_ == other.kilogram_ && ampere_ == other.ampere_ &&
                candela_ == other.candela_ && kelvin_ == other.kelvin_ &&
                currency_ == other.currency_;
        }